

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t * Amap_ManProduceNetwork(Abc_Ntk_t *pNtk,Vec_Ptr_t *vMapping)

{
  int iVar1;
  uint uVar2;
  undefined8 *puVar3;
  char *pName;
  uint uVar4;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar5;
  Abc_Ntk_t *pNtk_00;
  uint *__ptr;
  void *pvVar6;
  void **ppvVar7;
  Abc_Obj_t *pObj;
  uint uVar8;
  Mio_Library_t *pMVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint local_4c;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (0 < vMapping->nSize) {
    lVar11 = 0;
    do {
      puVar3 = (undefined8 *)vMapping->pArray[lVar11];
      pName = (char *)*puVar3;
      if ((pName != (char *)0x0) &&
         (pMVar9 = pLib, pMVar5 = Mio_LibraryReadGateByName(pLib,pName,(char *)0x0),
         pMVar5 == (Mio_Gate_t *)0x0)) {
        Abc_Print((int)pMVar9,"Current library does not contain gate \"%s\".\n",*puVar3);
        return (Abc_Ntk_t *)0x0;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < vMapping->nSize);
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_MAP);
  pNtk_00->pManFunc = pLib;
  uVar8 = vMapping->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar4 = 8;
  if (6 < uVar8 - 1) {
    uVar4 = uVar8;
  }
  __ptr[1] = 0;
  *__ptr = uVar4;
  if (uVar4 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc((long)(int)uVar4 << 3);
  }
  *(void **)(__ptr + 2) = pvVar6;
  local_4c = 0;
  uVar8 = 0;
  if (0 < vMapping->nSize) {
    lVar11 = 0;
    local_4c = 0;
    uVar8 = 0;
    do {
      puVar3 = (undefined8 *)vMapping->pArray[lVar11];
      if (*(short *)(puVar3 + 1) == 1) {
        if (((int)local_4c < 0) || (pNtk_00->vCos->nSize <= (int)local_4c)) {
LAB_002ace59:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        ppvVar7 = pNtk_00->vCos->pArray;
        uVar4 = uVar8;
        uVar8 = local_4c;
        local_4c = local_4c + 1;
LAB_002acce6:
        pObj = (Abc_Obj_t *)ppvVar7[uVar8];
        uVar8 = uVar4;
      }
      else {
        if (*(short *)(puVar3 + 1) == -1) {
          if (((int)uVar8 < 0) || (pNtk_00->vCis->nSize <= (int)uVar8)) goto LAB_002ace59;
          ppvVar7 = pNtk_00->vCis->pArray;
          uVar4 = uVar8 + 1;
          goto LAB_002acce6;
        }
        pObj = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
        pMVar5 = Mio_LibraryReadGateByName(pLib,(char *)*puVar3,(char *)0x0);
        (pObj->field_5).pData = pMVar5;
      }
      if (0 < *(short *)((long)puVar3 + 10)) {
        lVar12 = 0;
        do {
          iVar1 = *(int *)((long)puVar3 + lVar12 * 4 + 0xc);
          if (((long)iVar1 < 0) || ((int)__ptr[1] <= iVar1)) goto LAB_002ace59;
          Abc_ObjAddFanin(pObj,*(Abc_Obj_t **)(*(long *)(__ptr + 2) + (long)iVar1 * 8));
          lVar12 = lVar12 + 1;
        } while (lVar12 < *(short *)((long)puVar3 + 10));
      }
      uVar4 = __ptr[1];
      uVar2 = *__ptr;
      if (uVar4 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar6 = malloc(0x80);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar10 = 0x10;
        }
        else {
          uVar10 = uVar2 * 2;
          if ((int)uVar10 <= (int)uVar2) goto LAB_002acdb7;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar6 = malloc((ulong)uVar2 << 4);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar2 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar6;
        *__ptr = uVar10;
      }
LAB_002acdb7:
      __ptr[1] = uVar4 + 1;
      *(Abc_Obj_t **)(*(long *)(__ptr + 2) + (long)(int)uVar4 * 8) = pObj;
      lVar11 = lVar11 + 1;
    } while (lVar11 < vMapping->nSize);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  if (uVar8 == pNtk_00->vCis->nSize) {
    if (local_4c == pNtk_00->vCos->nSize) {
      Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
      return pNtk_00;
    }
    __assert_fail("iPos == Abc_NtkCoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x118e,"Abc_Ntk_t *Amap_ManProduceNetwork(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  __assert_fail("iPis == Abc_NtkCiNum(pNtkNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                ,0x118d,"Abc_Ntk_t *Amap_ManProduceNetwork(Abc_Ntk_t *, Vec_Ptr_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Amap_ManProduceNetwork( Abc_Ntk_t * pNtk, Vec_Ptr_t * vMapping )
{
//    extern void * Abc_FrameReadLibGen();
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Amap_Out_t * pRes;
    Vec_Ptr_t * vNodesNew;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNodeNew, * pFaninNew;
    int i, k, iPis, iPos, nDupGates;
    // make sure gates exist in the current library
    Vec_PtrForEachEntry( Amap_Out_t *, vMapping, pRes, i )
        if ( pRes->pName && Mio_LibraryReadGateByName( pLib, pRes->pName, NULL ) == NULL )
        {
            Abc_Print( 1, "Current library does not contain gate \"%s\".\n", pRes->pName );
            return NULL;
        }
    // create the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_MAP );
    pNtkNew->pManFunc = pLib;
    iPis = iPos = 0;
    vNodesNew = Vec_PtrAlloc( Vec_PtrSize(vMapping) );
    Vec_PtrForEachEntry( Amap_Out_t *, vMapping, pRes, i )
    {
        if ( pRes->Type == -1 )
            pNodeNew = Abc_NtkCi( pNtkNew, iPis++ );
        else if ( pRes->Type == 1 )
            pNodeNew = Abc_NtkCo( pNtkNew, iPos++ );
        else
        {
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Mio_LibraryReadGateByName( pLib, pRes->pName, NULL );
        }
        for ( k = 0; k < pRes->nFans; k++ )
        {
            pFaninNew = (Abc_Obj_t *)Vec_PtrEntry( vNodesNew, pRes->pFans[k] );
            Abc_ObjAddFanin( pNodeNew, pFaninNew );
        }
        Vec_PtrPush( vNodesNew, pNodeNew );
    }
    Vec_PtrFree( vNodesNew );
    assert( iPis == Abc_NtkCiNum(pNtkNew) );
    assert( iPos == Abc_NtkCoNum(pNtkNew) );
    // decouple the PO driver nodes to reduce the number of levels
    nDupGates = Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
//    if ( nDupGates && Map_ManReadVerbose(pMan) )
//        Abc_Print( 1, "Duplicated %d gates to decouple the CO drivers.\n", nDupGates );
    return pNtkNew;
}